

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall
CVmObjBigNum::mul_val(CVmObjBigNum *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *val)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  vm_val_t val2;
  vm_val_t local_38;
  
  local_38.typ = val->typ;
  local_38._4_4_ = *(undefined4 *)&val->field_0x4;
  local_38.val = val->val;
  iVar3 = cvt_to_bignum(this,self,&local_38);
  pvVar2 = sp_;
  if (iVar3 != 0) {
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    pvVar2 = sp_;
    sp_ = sp_ + 1;
    pvVar2->typ = local_38.typ;
    *(undefined4 *)&pvVar2->field_0x4 = local_38._4_4_;
    pvVar2->val = local_38.val;
    compute_prod(result,(this->super_CVmObject).ext_,
                 *(char **)((long)&G_obj_table_X.pages_[local_38.val.obj >> 0xc]
                                   [local_38.val.obj & 0xfff].ptr_ + 8));
    sp_ = sp_ + -2;
    return 1;
  }
  err_throw(0x7d3);
}

Assistant:

int CVmObjBigNum::mul_val(VMG_ vm_val_t *result,
                          vm_obj_id_t self, const vm_val_t *val)
{
    vm_val_t val2;

    /* convert it */
    val2 = *val;
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* this type is not convertible to BigNumber, so we can't add it */
        err_throw(VMERR_BAD_TYPE_ADD);
    }

    /* push 'self' and the other value to protect against GC */
    G_stk->push()->set_obj(self);
    G_stk->push(&val2);

    /* compute the product */
    compute_prod(vmg_ result, ext_, get_objid_ext(vmg_ val2.val.obj));

    /* discard the GC protection items */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}